

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniform01_dist.hpp
# Opt level: O0

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,param_type *param_2)

{
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var1;
  basic_istream<char,_std::char_traits<char>_> *this;
  basic_istream<char,_std::char_traits<char>_> *in_RDI;
  fmtflags flags;
  delim_c *in_stack_ffffffffffffffc8;
  
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  this = in_RDI + *(long *)(*(long *)in_RDI + -0x18);
  _Var1 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var1 = Catch::clara::std::operator|(_Var1,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)this,_Var1);
  utility::delim('\0');
  utility::operator>>(this,in_stack_ffffffffffffffc8);
  utility::delim('\0');
  utility::operator>>(this,in_stack_ffffffffffffffc8);
  Catch::clara::std::ios_base::flags
            ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)),__fmtfl);
  return in_RDI;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, param_type &) {
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> utility::delim(')');
        in.flags(flags);
        return in;
      }